

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture_image.h
# Opt level: O0

Texture * TextureImage::Texture::loadTexture(string *_name,string *_filename)

{
  bool bVar1;
  __type _Var2;
  ostream *poVar3;
  ulong uVar4;
  char *pcVar5;
  Texture *this;
  pointer ppVar6;
  stbi_uc *retval_from_stbi_load;
  GLubyte *pGVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TextureImage::Texture_*>_>,_bool>
  pVar8;
  GLubyte *errString_1;
  GLenum format;
  uchar *data;
  int local_e8;
  int channels;
  int height;
  int width;
  Texture *target;
  undefined1 local_d0;
  Texture *local_c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TextureImage::Texture_*>
  local_c0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TextureImage::Texture_*>_>
  local_98;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TextureImage::Texture_*>_>,_bool>
  insertion;
  FILE *fi;
  string local_70;
  string local_50;
  GLubyte *local_30;
  GLubyte *errString;
  string *psStack_20;
  GLenum gl_error_code;
  string *_filename_local;
  string *_name_local;
  
  errString._4_4_ = 0;
  psStack_20 = _filename;
  _filename_local = _name;
  errString._4_4_ = glGetError();
  if (errString._4_4_ != 0) {
    local_30 = glewGetErrorString(errString._4_4_);
    poVar3 = std::operator<<((ostream *)&std::cout,"ERROR before loadTexture():");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,local_30);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)_name);
  poVar3 = std::operator<<(poVar3,"<>");
  poVar3 = std::operator<<(poVar3,(string *)_filename);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  uVar4 = std::__cxx11::string::empty();
  if (((uVar4 & 1) != 0) || (bVar1 = std::operator==(_filename,""), bVar1)) {
    std::__cxx11::string::string((string *)&local_70,(string *)_name);
    testAllSuffix(&local_50,&local_70);
    std::__cxx11::string::operator=((string *)_filename,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      _name_local = (string *)error;
      return (Texture *)_name_local;
    }
  }
  pcVar5 = (char *)std::__cxx11::string::c_str();
  insertion._8_8_ = fopen(pcVar5,"r");
  if ((FILE *)insertion._8_8_ == (FILE *)0x0) {
    _name_local = (string *)error;
  }
  else {
    fclose((FILE *)insertion._8_8_);
    this = (Texture *)operator_new(0x60);
    Texture(this);
    local_c8 = this;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TextureImage::Texture_*>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TextureImage::Texture_*,_true>
              (&local_c0,_name,&local_c8);
    pVar8 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TextureImage::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TextureImage::Texture_*>_>_>
            ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TextureImage::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TextureImage::Texture_*>_>_>
                      *)allTexture_abi_cxx11_,&local_c0);
    target = (Texture *)pVar8.first._M_node;
    local_d0 = pVar8.second;
    local_98._M_node = (_Base_ptr)target;
    insertion.first._M_node._0_1_ = local_d0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TextureImage::Texture_*>
    ::~pair(&local_c0);
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TextureImage::Texture_*>_>
             ::operator->(&local_98);
    _height = ppVar6->second;
    if (((byte)insertion.first._M_node & 1) == 0) {
      _Var2 = std::operator==(&_height->filename,_filename);
      if ((_Var2) && ((_height->available & 1U) != 0)) {
        return _height;
      }
      clear(_height);
    }
    std::__cxx11::string::operator=((string *)&_height->name,(string *)_name);
    std::__cxx11::string::operator=((string *)&_height->filename,(string *)_filename);
    stbi_set_flip_vertically_on_load(1);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    retval_from_stbi_load = stbi_load(pcVar5,&channels,&local_e8,(int *)((long)&data + 4),0);
    if (retval_from_stbi_load == (stbi_uc *)0x0) {
      _name_local = (string *)error;
    }
    else {
      errString_1._4_4_ = 0x1908;
      if (data._4_4_ == 1) {
        errString_1._4_4_ = 0x2002;
      }
      if (data._4_4_ == 2) {
        errString_1._4_4_ = 0x8227;
      }
      if (data._4_4_ == 3) {
        errString_1._4_4_ = 0x1907;
      }
      glGenTextures(1,&_height->tex);
      glBindTexture(0xde1,_height->tex);
      glTexParameteri(0xde1,0x2802,0x2901);
      glTexParameteri(0xde1,0x2803,0x2901);
      glTexParameteri(0xde1,0x2800,0x2601);
      glTexParameteri(0xde1,0x2801,0x2601);
      glTexImage2D(0xde1,0,0x1908,_height->width,_height->height,0,errString_1._4_4_,0x1401,
                   retval_from_stbi_load);
      (*__glewGenerateMipmap)(0xde1);
      glBindTexture(0xde1,0);
      stbi_image_free(retval_from_stbi_load);
      errString._4_4_ = glGetError();
      if (errString._4_4_ == 0) {
        _height->available = true;
        _name_local = (string *)_height;
      }
      else {
        pGVar7 = glewGetErrorString(errString._4_4_);
        poVar3 = std::operator<<((ostream *)&std::cout,"ERROR in loadTexture():");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)&std::cout,pGVar7);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        _name_local = (string *)error;
      }
    }
  }
  return (Texture *)_name_local;
}

Assistant:

static Texture &loadTexture(std::string _name, std::string _filename = std::string()) {
            GLenum gl_error_code = GL_NO_ERROR;
            if ((gl_error_code = glGetError()) != GL_NO_ERROR) {
                const GLubyte *errString = glewGetErrorString(gl_error_code);
                std::cout << "ERROR before loadTexture():" << std::endl;
                std::cout << errString << std::endl;
            }
            std::cout << _name << "<>" << _filename << std::endl;
            if (_filename.empty() || _filename == "") {
                _filename = testAllSuffix(_name);
                if (_filename.empty()) return error;
            }
            FILE *fi = fopen(_filename.c_str(), "r");
            if (fi == NULL) return error;
            fclose(fi);

            std::pair<Name2Texture::iterator, bool> insertion =
                    allTexture.insert(Name2Texture::value_type(_name, new Texture()));
            Texture &target = *(insertion.first->second);
            if (!insertion.second) {
                if (target.filename == _filename && target.available) {
                    return target;
                } else {
                    target.clear();
                }
            }

            target.name = _name;
            target.filename = _filename;

            stbi_set_flip_vertically_on_load(true);
            int width, height, channels;
            unsigned char *data =
                    stbi_load(_filename.c_str(), &width, &height, &channels, 0);
            if (!data) {
                return error;
            }

            GLenum format = GL_RGBA;
            if (channels == 1) {
                format = GL_R;
            }
            if (channels == 2) {
                format = GL_RG;
            }
            if (channels == 3) {
                format = GL_RGB;
            }

            glGenTextures(1, &target.tex);
            glBindTexture(GL_TEXTURE_2D, target.tex);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
            glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, target.width, target.height,
                         0, format, GL_UNSIGNED_BYTE, data);
            glGenerateMipmap(GL_TEXTURE_2D);
            glBindTexture(GL_TEXTURE_2D, 0);

            stbi_image_free(data);

            if ((gl_error_code = glGetError()) != GL_NO_ERROR) {
                const GLubyte *errString = glewGetErrorString(gl_error_code);
                std::cout << "ERROR in loadTexture():" << std::endl;
                std::cout << errString << std::endl;
                return error;
            }

            target.available = true;
            return target;
        }